

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  REF_CELL *ppRVar5;
  REF_GRID pRVar6;
  undefined8 uVar7;
  REF_INT cell;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  REF_INT nmark;
  REF_BOOL again;
  undefined8 local_38;
  
  local_38 = in_RAX;
  uVar3 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar3 == 0) {
    uVar9 = 0;
    do {
      local_38 = local_38 & 0xffffffff;
      pRVar6 = ref_subdiv->grid;
      ppRVar5 = pRVar6->cell + 8;
      lVar10 = 8;
      do {
        pRVar2 = *ppRVar5;
        iVar4 = pRVar2->max;
        if (0 < iVar4) {
          cell = 0;
          do {
            if ((pRVar2->c2n[(long)cell * (long)pRVar2->size_per] != -1) && (pRVar2->node_per == 4))
            {
              ref_subdiv_unmark_tet(ref_subdiv,cell,(REF_BOOL *)((long)&local_38 + 4));
              iVar4 = pRVar2->max;
            }
            cell = cell + 1;
          } while (cell < iVar4);
          pRVar6 = ref_subdiv->grid;
        }
        ppRVar5 = pRVar6->cell + lVar10 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
      uVar3 = ref_edge_ghost_min_int(ref_subdiv->edge,pRVar6->mpi,ref_subdiv->mark);
      if (uVar3 != 0) {
        pcVar8 = "ghost mark";
        uVar7 = 0x248;
        goto LAB_0014ad21;
      }
      uVar1 = uVar9 + 1;
      if (4 < uVar9) {
        uVar3 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_38);
        if (uVar3 != 0) {
          pcVar8 = "count";
          uVar7 = 0x24b;
          goto LAB_0014ad21;
        }
        if (ref_subdiv->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark relaxations\n",local_38 & 0xffffffff,(ulong)uVar1
                );
        }
        if (uVar1 == 200) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x251,"ref_subdiv_unmark_relax","too many sweeps, stop inf loop");
          return 1;
        }
      }
      uVar3 = ref_mpi_all_or(ref_subdiv->grid->mpi,(REF_BOOL *)((long)&local_38 + 4));
      if (uVar3 != 0) {
        pcVar8 = "mpi all or";
        uVar7 = 0x253;
        goto LAB_0014ad21;
      }
      uVar9 = uVar1;
    } while (local_38._4_4_ != 0);
    uVar3 = 0;
    if (ref_subdiv->instrument != 0) {
      uVar3 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_38);
      if (uVar3 == 0) {
        uVar3 = 0;
        if (ref_subdiv->grid->mpi->id == 0) {
          uVar3 = 0;
          printf(" %d edges marked after %d unmark relaxations\n",local_38 & 0xffffffff,(ulong)uVar1
                );
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               599,"ref_subdiv_unmark_relax",(ulong)uVar3,"count");
      }
    }
  }
  else {
    pcVar8 = "ghost mark";
    uVar7 = 0x22e;
LAB_0014ad21:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar7,
           "ref_subdiv_unmark_relax",(ulong)uVar3,pcVar8);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  /* make sure consistent before starting */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:

            RSS(ref_subdiv_unmark_tet(ref_subdiv, cell, &again), "unmark tet");

            break;
          default:
            /* RSS(REF_IMPLEMENT,"implement cell type"); */
            break;
        }
      }
    }

    /* most conservative, unmark if any ghosts unmarked */
    RSS(ref_edge_ghost_min_int(ref_subdiv_edge(ref_subdiv),
                               ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    if (nsweeps > 5) {
      RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
      if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
        printf(" %d edges marked after %d unmark relaxations\n", nmark,
               nsweeps);
    }

    RUS(200, nsweeps, "too many sweeps, stop inf loop");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d unmark relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}